

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

int cm_zlib_gzflush(gzFile file,int flush)

{
  undefined4 local_30;
  int err;
  gz_stream *s;
  int flush_local;
  gzFile file_local;
  
  file_local._4_4_ = do_flush(file,flush);
  if (file_local._4_4_ == 0) {
    fflush(*(FILE **)((long)file + 0x78));
    if (*(int *)((long)file + 0x70) == 1) {
      local_30 = 0;
    }
    else {
      local_30 = *(int *)((long)file + 0x70);
    }
    file_local._4_4_ = local_30;
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzflush (file, flush)
     gzFile file;
     int flush;
{
    gz_stream *s = (gz_stream*)file;
    int err = do_flush (file, flush);

    if (err) return err;
    fflush(s->file);
    return  s->z_err == Z_STREAM_END ? Z_OK : s->z_err;
}